

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1.h
# Opt level: O3

void ncnn::conv1x1s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  void *pvVar19;
  float *pfVar20;
  uint uVar21;
  void *pvVar22;
  long lVar23;
  int remain;
  uint uVar24;
  long lVar25;
  long lVar26;
  int iVar28;
  undefined1 auVar27 [16];
  undefined4 uVar29;
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  long local_68;
  
  auVar13 = _DAT_00163380;
  auVar12 = _DAT_00163370;
  auVar11 = _DAT_00162c50;
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    uVar3 = bottom_blob->c;
    lVar23 = (long)(int)uVar3;
    pvVar4 = _kernel->data;
    uVar24 = top_blob->h * top_blob->w;
    pvVar5 = _bias->data;
    lVar14 = top_blob->cstep * top_blob->elemsize;
    pvVar6 = top_blob->data;
    lVar25 = bottom_blob->cstep * bottom_blob->elemsize;
    pvVar7 = bottom_blob->data;
    lVar26 = (ulong)uVar24 - 1;
    auVar27._8_4_ = (int)lVar26;
    auVar27._0_8_ = lVar26;
    auVar27._12_4_ = (int)((ulong)lVar26 >> 0x20);
    lVar26 = (long)pvVar6 + 0xc;
    local_68 = 0;
    auVar27 = auVar27 ^ _DAT_00162c50;
    pvVar22 = pvVar6;
    do {
      if (pvVar5 == (void *)0x0) {
        uVar29 = 0;
      }
      else {
        uVar29 = *(undefined4 *)((long)pvVar5 + local_68 * 4);
      }
      if (0 < (int)uVar24) {
        uVar17 = 0;
        do {
          auVar30._8_4_ = (int)uVar17;
          auVar30._0_8_ = uVar17;
          auVar30._12_4_ = (int)(uVar17 >> 0x20);
          auVar31 = (auVar30 | auVar13) ^ auVar11;
          iVar28 = auVar27._4_4_;
          if ((bool)(~(iVar28 < auVar31._4_4_ ||
                      auVar27._0_4_ < auVar31._0_4_ && auVar31._4_4_ == iVar28) & 1)) {
            *(undefined4 *)(lVar26 + -0xc + uVar17 * 4) = uVar29;
          }
          if (auVar31._12_4_ <= auVar27._12_4_ &&
              (auVar31._8_4_ <= auVar27._8_4_ || auVar31._12_4_ != auVar27._12_4_)) {
            *(undefined4 *)(lVar26 + -8 + uVar17 * 4) = uVar29;
          }
          auVar30 = (auVar30 | auVar12) ^ auVar11;
          iVar32 = auVar30._4_4_;
          if (iVar32 <= iVar28 && (iVar32 != iVar28 || auVar30._0_4_ <= auVar27._0_4_)) {
            *(undefined4 *)(lVar26 + -4 + uVar17 * 4) = uVar29;
            *(undefined4 *)(lVar26 + uVar17 * 4) = uVar29;
          }
          uVar17 = uVar17 + 4;
        } while ((uVar24 + 3 & 0xfffffffc) != uVar17);
      }
      uVar17 = 0;
      if (3 < (int)uVar3) {
        uVar15 = 0;
        do {
          if (0 < (int)uVar24) {
            pfVar18 = (float *)((long)pvVar4 + uVar15 * 4 + local_68 * lVar23 * 4);
            fVar1 = *pfVar18;
            fVar8 = pfVar18[1];
            fVar9 = pfVar18[2];
            fVar10 = pfVar18[3];
            pfVar20 = (float *)(lVar25 * uVar15 + (long)pvVar7);
            pfVar18 = (float *)(lVar14 * local_68 + (long)pvVar6);
            uVar21 = uVar24 + 1;
            do {
              *pfVar18 = *(float *)((long)pfVar20 + lVar25 * 3) * fVar10 +
                         *(float *)((long)pfVar20 + lVar25) * fVar8 +
                         *(float *)((long)pfVar20 + lVar25 * 2) * fVar9 + *pfVar20 * fVar1 +
                         *pfVar18;
              pfVar20 = pfVar20 + 1;
              pfVar18 = pfVar18 + 1;
              uVar21 = uVar21 - 1;
            } while (1 < uVar21);
          }
          uVar17 = uVar15 + 4;
          lVar16 = uVar15 + 7;
          uVar15 = uVar17;
        } while (lVar16 < lVar23);
      }
      if ((int)uVar17 < (int)uVar3) {
        uVar17 = uVar17 & 0xffffffff;
        pvVar19 = (void *)(lVar25 * uVar17 + (long)pvVar7);
        do {
          if (0 < (int)uVar24) {
            fVar1 = *(float *)((long)pvVar4 + uVar17 * 4 + local_68 * lVar23 * 4);
            lVar16 = 0;
            uVar21 = uVar24 + 1;
            do {
              *(float *)((long)pvVar22 + lVar16) =
                   *(float *)((long)pvVar19 + lVar16) * fVar1 + *(float *)((long)pvVar22 + lVar16);
              uVar21 = uVar21 - 1;
              lVar16 = lVar16 + 4;
            } while (1 < uVar21);
          }
          uVar17 = uVar17 + 1;
          pvVar19 = (void *)((long)pvVar19 + lVar25);
        } while (uVar17 != uVar3);
      }
      local_68 = local_68 + 1;
      lVar26 = lVar26 + lVar14;
      pvVar22 = (void *)((long)pvVar22 + lVar14);
    } while (local_68 != iVar2);
  }
  return;
}

Assistant:

static void conv1x1s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        int q = 0;

        for (; q+3<inch; q+=4)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);
            const float* img1 = bottom_blob.channel(q+1);
            const float* img2 = bottom_blob.channel(q+2);
            const float* img3 = bottom_blob.channel(q+3);

            const float* kernel0 = kernel + p*inch  + q;
            const float k0 = kernel0[0];
            const float k1 = kernel0[1];
            const float k2 = kernel0[2];
            const float k3 = kernel0[3];

            const float* r0 = img0;
            const float* r1 = img1;
            const float* r2 = img2;
            const float* r3 = img3;

            int size = outw * outh;

            int remain = size;

            for (; remain>0; remain--)
            {
                float sum = *r0 * k0;
                float sum1 = *r1 * k1;
                float sum2 = *r2 * k2;
                float sum3 = *r3 * k3;

                *outptr += sum + sum1 + sum2 + sum3;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
            }

        }

        for (; q<inch; q++)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch  + q;
            const float k0 = kernel0[0];

            const float* r0 = img0;

            int size = outw * outh;

            int remain = size;

            for (; remain>0; remain--)
            {
                float sum = *r0 * k0;

                *outptr += sum;

                r0++;
                outptr++;
            }

        }
    }

}